

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

CESkyCoord * __thiscall
CESkyCoord::ConvertToEcliptic(CESkyCoord *this,CEDate *date,CEObserver *observer)

{
  CEObserver *in_RDX;
  CEDate *in_RSI;
  CESkyCoord *in_RDI;
  CESkyCoord *unaff_retaddr;
  CESkyCoord *ecliptic;
  CEDate *in_stack_000000f0;
  CESkyCoord *in_stack_000000f8;
  CESkyCoord *in_stack_00000100;
  CESkyCoord *in_stack_ffffffffffffffa8;
  CESkyCoord *this_00;
  CESkyCoord *in_stack_ffffffffffffffd0;
  CEDate *date_00;
  CESkyCoord *out_ecliptic;
  
  this_00 = in_RDI;
  date_00 = in_RSI;
  out_ecliptic = in_RDI;
  CESkyCoord(in_stack_ffffffffffffffd0);
  if (*(int *)&(in_RSI->gregorian_date_vect_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish == 0) {
    CIRS2Ecliptic(unaff_retaddr,out_ecliptic,date_00);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 1) {
    ICRS2Ecliptic(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 2) {
    Galactic2Ecliptic(unaff_retaddr,out_ecliptic,date_00);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 3) {
    Observed2Ecliptic(unaff_retaddr,out_ecliptic,date_00,in_RDX);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 4) {
    SetCoordinates(this_00,in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

CESkyCoord CESkyCoord::ConvertToEcliptic(const CEDate&     date,
                                         const CEObserver& observer)
{
    // Create return coordinates
    CESkyCoord ecliptic;

    // Convert
    if (coord_type_ == CESkyCoordType::CIRS) {
        // CIRS -> ECLIPTIC
        CIRS2Ecliptic(*this, &ecliptic, date);
    } else if (coord_type_ == CESkyCoordType::ICRS) {
        // ICRS -> ECLIPTIC
        ICRS2Ecliptic(*this, &ecliptic, date);
    } else if (coord_type_ == CESkyCoordType::GALACTIC) {
        // GALACTIC -> ECLIPTIC
        Galactic2Ecliptic(*this, &ecliptic, date);
    } else if (coord_type_ == CESkyCoordType::OBSERVED) {
        // OBSERVED -> ECLIPTIC
        Observed2Ecliptic(*this, &ecliptic, date, observer);
    } else if (coord_type_ == CESkyCoordType::ECLIPTIC) {
        // ECLIPTIC -> ECLIPTIC
        ecliptic.SetCoordinates(*this);
    }
    
    return ecliptic;
}